

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_gen.h
# Opt level: O3

void __thiscall
IntegerRandomGenerator::IntegerRandomGenerator
          (IntegerRandomGenerator *this,vector<double,_std::allocator<double>_> *distribution,
          vector<int,_std::allocator<int>_> *values)

{
  double *pdVar1;
  iterator __position;
  iterator __position_00;
  vector<int,std::allocator<int>> *this_00;
  invalid_argument *this_01;
  iterator __begin2;
  double *pdVar2;
  int *piVar3;
  int *piVar4;
  int x_i;
  double p_i;
  int local_44;
  vector<int,std::allocator<int>> *local_40;
  double local_38;
  
  local_40 = (vector<int,std::allocator<int>> *)&this->mValues;
  (this->mValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->mValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->mDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->mValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->mDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->mDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pdVar2 = (distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  piVar3 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if ((long)pdVar1 - (long)pdVar2 >> 3 == (long)piVar4 - (long)piVar3 >> 2) {
    if (pdVar2 != pdVar1) {
      do {
        local_38 = *pdVar2;
        __position._M_current =
             (this->mDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->mDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)this,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          (this->mDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        pdVar2 = pdVar2 + 1;
      } while (pdVar2 != pdVar1);
      piVar3 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    this_00 = local_40;
    if (piVar3 != piVar4) {
      do {
        local_44 = *piVar3;
        __position_00._M_current =
             (this->mValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->mValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this_00,__position_00,&local_44);
        }
        else {
          *__position_00._M_current = local_44;
          (this->mValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position_00._M_current + 1;
        }
        piVar3 = piVar3 + 1;
      } while (piVar3 != piVar4);
    }
    return;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_01,"distribution and values vectors shall have the same length");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

IntegerRandomGenerator(std::vector<double> distribution, std::vector<int> values)
    {
        size_t size_dist = distribution.size();
        size_t size_val  = values.size();
        if( size_dist != size_val )
        {
            throw std::invalid_argument("distribution and values vectors shall have the same length");
        }
        else
        {
            for( double p_i : distribution )
            {
                mDist.push_back(p_i);
            }
            for( int x_i : values )
            {
                mValues.push_back(x_i);
            }
        }
    }